

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readSnormScale<short>(Vec4 *dst,int size,void *ptr)

{
  float *pfVar1;
  short local_2c;
  short local_2a;
  short local_28;
  short local_26;
  short aligned [4];
  deUint32 range;
  void *ptr_local;
  int size_local;
  Vec4 *dst_local;
  
  aligned[0] = -1;
  aligned[1] = 0;
  unique0x1000008c = ptr;
  ::deMemcpy(&local_2c,ptr,(long)size * 2);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = ((float)(int)local_2c + (float)(int)local_2c + 1.0) / 65535.0;
  if (1 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = ((float)(int)local_2a + (float)(int)local_2a + 1.0) / 65535.0;
  }
  if (2 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = ((float)(int)local_28 + (float)(int)local_28 + 1.0) / 65535.0;
  }
  if (3 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = ((float)(int)local_26 + (float)(int)local_26 + 1.0) / 65535.0;
  }
  return;
}

Assistant:

inline void readSnormScale (tcu::Vec4& dst, const int size, const void* ptr)
{
	// Scaled formats, GLES2-style conversion: (2c + 1) / (2^b - 1)
	const deUint32 range = (deUint32)((1ull << (sizeof(SrcScalarType)*8))-1);

	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[0] = (float(aligned[0]) * 2.0f + 1.0f) / float(range);
	if (size >= 2) dst[1] = (float(aligned[1]) * 2.0f + 1.0f) / float(range);
	if (size >= 3) dst[2] = (float(aligned[2]) * 2.0f + 1.0f) / float(range);
	if (size >= 4) dst[3] = (float(aligned[3]) * 2.0f + 1.0f) / float(range);
}